

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O0

void __thiscall
Rml::ElementInstancerElement::~ElementInstancerElement(ElementInstancerElement *this)

{
  bool bVar1;
  ElementInstancerPools *pEVar2;
  Element *this_00;
  undefined8 uVar3;
  String local_40;
  Iterator local_20;
  Iterator it;
  int num_elements;
  ElementInstancerElement *this_local;
  
  (this->super_ElementInstancer)._vptr_ElementInstancer =
       (_func_int **)&PTR__ElementInstancerElement_00816920;
  pEVar2 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                     ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                      element_instancer_pools);
  it.node._4_4_ = Pool<Rml::Element>::GetNumAllocatedObjects(&pEVar2->pool_element);
  if (0 < (int)it.node._4_4_) {
    Log::Message(LT_WARNING,"--- Found %d leaked element(s) ---",(ulong)it.node._4_4_);
    pEVar2 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                       ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                        element_instancer_pools);
    local_20 = Pool<Rml::Element>::Begin(&pEVar2->pool_element);
    while( true ) {
      bVar1 = Pool::Iterator::operator_cast_to_bool((Iterator *)&local_20);
      if (!bVar1) break;
      this_00 = Pool<Rml::Element>::Iterator::operator->(&local_20);
      Element::GetAddress_abi_cxx11_(&local_40,this_00,false,true);
      uVar3 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"    %s",uVar3);
      ::std::__cxx11::string::~string((string *)&local_40);
      Pool<Rml::Element>::Iterator::operator++(&local_20);
    }
    Log::Message(LT_WARNING,"------");
  }
  ElementInstancer::~ElementInstancer(&this->super_ElementInstancer);
  return;
}

Assistant:

ElementInstancerElement::~ElementInstancerElement()
{
	int num_elements = element_instancer_pools->pool_element.GetNumAllocatedObjects();
	if (num_elements > 0)
	{
		Log::Message(Log::LT_WARNING, "--- Found %d leaked element(s) ---", num_elements);

		for (auto it = element_instancer_pools->pool_element.Begin(); it; ++it)
			Log::Message(Log::LT_WARNING, "    %s", it->GetAddress().c_str());

		Log::Message(Log::LT_WARNING, "------");
	}
}